

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_operators.cpp
# Opt level: O0

Matrix<long_double> *
neural_networks::utilities::matrix_operators::create(NeuralMatrix *other,Mode mod)

{
  longdouble lVar1;
  code *pcVar2;
  ostream *poVar3;
  const_reference pvVar4;
  const_reference ppNVar5;
  reference pvVar6;
  reference pvVar7;
  ulong local_48;
  size_t j;
  size_t i;
  Matrix<long_double> *new_matrix;
  Mode mod_local;
  NeuralMatrix *other_local;
  
  other_local = (NeuralMatrix *)operator_new(0x30);
  Matrix<long_double>::Matrix
            ((Matrix<long_double> *)other_local,
             (other->super_Matrix<neural_networks::utilities::Neuron_*>).N,
             (other->super_Matrix<neural_networks::utilities::Neuron_*>).M);
  if ((Matrix<long_double> *)other_local == (Matrix<long_double> *)0x0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Error: Failed to copy NeuralMatrix object at [")
    ;
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,other);
    std::operator<<(poVar3,"]; not enough space\n");
    other_local = (NeuralMatrix *)0x0;
  }
  else if (mod == data) {
    for (j = 0; j < (other->super_Matrix<neural_networks::utilities::Neuron_*>).N; j = j + 1) {
      for (local_48 = 0; local_48 < (other->super_Matrix<neural_networks::utilities::Neuron_*>).M;
          local_48 = local_48 + 1) {
        pvVar4 = std::
                 vector<std::vector<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>,_std::allocator<std::vector<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>_>_>
                 ::operator[](&(other->super_Matrix<neural_networks::utilities::Neuron_*>).matrix,j)
        ;
        ppNVar5 = std::
                  vector<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>
                  ::operator[](pvVar4,local_48);
        lVar1 = (*ppNVar5)->data;
        pvVar6 = std::
                 vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                 ::operator[](&((Matrix<long_double> *)other_local)->matrix,j);
        pvVar7 = std::vector<long_double,_std::allocator<long_double>_>::operator[](pvVar6,local_48)
        ;
        *(longdouble *)pvVar7 = lVar1;
      }
    }
  }
  else if (mod == function) {
    for (j = 0; j < (other->super_Matrix<neural_networks::utilities::Neuron_*>).N; j = j + 1) {
      for (local_48 = 0; local_48 < (other->super_Matrix<neural_networks::utilities::Neuron_*>).M;
          local_48 = local_48 + 1) {
        pvVar4 = std::
                 vector<std::vector<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>,_std::allocator<std::vector<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>_>_>
                 ::operator[](&(other->super_Matrix<neural_networks::utilities::Neuron_*>).matrix,j)
        ;
        ppNVar5 = std::
                  vector<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>
                  ::operator[](pvVar4,local_48);
        lVar1 = (*ppNVar5)->function;
        pvVar6 = std::
                 vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                 ::operator[](&((Matrix<long_double> *)other_local)->matrix,j);
        pvVar7 = std::vector<long_double,_std::allocator<long_double>_>::operator[](pvVar6,local_48)
        ;
        *(longdouble *)pvVar7 = lVar1;
      }
    }
  }
  else {
    if (mod != derivative) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    for (j = 0; j < (other->super_Matrix<neural_networks::utilities::Neuron_*>).N; j = j + 1) {
      for (local_48 = 0; local_48 < (other->super_Matrix<neural_networks::utilities::Neuron_*>).M;
          local_48 = local_48 + 1) {
        pvVar4 = std::
                 vector<std::vector<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>,_std::allocator<std::vector<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>_>_>
                 ::operator[](&(other->super_Matrix<neural_networks::utilities::Neuron_*>).matrix,j)
        ;
        ppNVar5 = std::
                  vector<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>
                  ::operator[](pvVar4,local_48);
        lVar1 = (*ppNVar5)->function_derivative;
        pvVar6 = std::
                 vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                 ::operator[](&((Matrix<long_double> *)other_local)->matrix,j);
        pvVar7 = std::vector<long_double,_std::allocator<long_double>_>::operator[](pvVar6,local_48)
        ;
        *(longdouble *)pvVar7 = lVar1;
      }
    }
  }
  return (Matrix<long_double> *)other_local;
}

Assistant:

Matrix<long double>* matrix_operators::create(const NeuralMatrix *other, const matrix_operators::Mode mod) {
    Matrix<long double> *new_matrix = new Matrix<long double>(other -> N, other -> M);
    if (new_matrix == nullptr) {
        std::cerr << "Error: Failed to copy NeuralMatrix object at [" << other << "]; not enough space\n";
        return nullptr;
    }
    register size_t i, j;
    switch(mod) {
        case matrix_operators::data: { // data
            for (i = 0; i < other->N; ++i) {
                for (j = 0; j < other->M; ++j) {
                    new_matrix -> matrix[i][j] = other -> matrix[i][j] -> data;
                }
            }
            return new_matrix;
        };
        case matrix_operators::function: {
            for (i = 0; i < other->N; ++i) {
                for (j = 0; j < other->M; ++j) {
                    new_matrix -> matrix[i][j] = other -> matrix[i][j] -> function;
                }
            }
            return new_matrix;
        };
        case matrix_operators::derivative: {
            for (i = 0; i < other->N; ++i) {
                for (j = 0; j < other->M; ++j) {
                    new_matrix -> matrix[i][j] = other -> matrix[i][j] -> function_derivative;
                }
            }
            return new_matrix;
        };
    }
}